

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extend.cpp
# Opt level: O0

void __thiscall CaDiCaL::External::push_witness_literal_on_extension_stack(External *this,int ilit)

{
  bool bVar1;
  int in_ESI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  int elit;
  undefined4 in_stack_fffffffffffffff0;
  
  Internal::externalize
            ((Internal *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20));
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
             (value_type_conflict3 *)in_RDI);
  bVar1 = marked((External *)CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RDI,in_ESI);
  if (!bVar1) {
    mark(this,(vector<bool,_std::allocator<bool>_> *)CONCAT44(ilit,elit),unaff_retaddr_00);
  }
  return;
}

Assistant:

void External::push_witness_literal_on_extension_stack (int ilit) {
  assert (ilit);
  const int elit = internal->externalize (ilit);
  assert (elit);
  extension.push_back (elit);
  LOG ("pushing witness literal %d on extension stack (internal %d)", elit,
       ilit);
  if (marked (witness, elit))
    return;
  LOG ("marking witness %d", elit);
  mark (witness, elit);
}